

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::moveLp(HEkk *this,HighsLpSolverObject *solver_object)

{
  HighsLp *pHVar1;
  HighsTimer *pHVar2;
  HighsOptions *pHVar3;
  
  pHVar1 = solver_object->lp_;
  HighsLp::operator=(&this->lp_,pHVar1);
  pHVar1->is_moved_ = true;
  (this->status_).has_ar_matrix = false;
  this->simplex_in_scaled_space_ = (this->lp_).is_scaled_;
  pHVar2 = solver_object->timer_;
  pHVar3 = solver_object->options_;
  this->callback_ = solver_object->callback_;
  this->options_ = pHVar3;
  this->timer_ = pHVar2;
  (this->analysis_).timer_ = pHVar2;
  initialiseEkk(this);
  return;
}

Assistant:

void HEkk::moveLp(HighsLpSolverObject& solver_object) {
  // Move the incumbent LP to EKK
  HighsLp& incumbent_lp = solver_object.lp_;
  this->lp_ = std::move(incumbent_lp);
  incumbent_lp.is_moved_ = true;
  //
  // Invalidate the row-wise matrix
  this->status_.has_ar_matrix = false;
  //
  // The simplex algorithm runs in the same space as the LP that has
  // just been moved in. This is a scaled space if the LP is scaled.
  this->simplex_in_scaled_space_ = this->lp_.is_scaled_;
  //
  // Update other EKK pointers. Currently just pointers to the
  // HighsOptions and HighsTimer members of the Highs class that are
  // communicated by reference via the HighsLpSolverObject instance.
  this->setPointers(&solver_object.callback_, &solver_object.options_,
                    &solver_object.timer_);
  // Initialise Ekk if this has not been done. Ekk isn't initialised
  // if moveLp hasn't been called for this instance of HiGHS, or if
  // the Ekk instance is junked due to removing rows from the LP
  this->initialiseEkk();
}